

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::InsertFunctionTypeIdCheck
          (Lowerer *this,RegOpnd *funcOpnd,Instr *insertBeforeInstr,BailOutKind bailOutKind,
          BailOutInfo *bailOutInfo)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  uint32 offset;
  BailOutInstrTemplate<IR::Instr> *instr;
  IndirOpnd *pIVar5;
  RegOpnd *baseOpnd;
  Instr *this_00;
  IntConstOpnd *this_01;
  undefined4 *puVar6;
  
  instr = IR::BailOutInstrTemplate<IR::Instr>::New
                    (BailOnNotEqual,bailOutKind,bailOutInfo,bailOutInfo->bailOutFunc);
  pIVar5 = IR::IndirOpnd::New(funcOpnd,8,TyUint64,insertBeforeInstr->m_func,false);
  baseOpnd = IR::RegOpnd::New(TyVar,insertBeforeInstr->m_func->topFunc);
  this_00 = IR::Instr::New(Ld_A,&baseOpnd->super_Opnd,&pIVar5->super_Opnd,insertBeforeInstr->m_func)
  ;
  if (this_00->m_func->topFunc->hasInstrNumber == false) {
    IR::Instr::SetByteCodeOffset(this_00,insertBeforeInstr);
  }
  IR::Instr::InsertBefore(insertBeforeInstr,this_00);
  offset = Js::Type::GetOffsetOfTypeId();
  pIVar5 = IR::IndirOpnd::New(baseOpnd,offset,TyInt32,insertBeforeInstr->m_func,false);
  this_01 = IR::IntConstOpnd::New(0x1b,TyInt32,insertBeforeInstr->m_func,false);
  if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005e3046;
    *puVar6 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if ((pIVar5->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_005e3046;
    *puVar6 = 0;
  }
  bVar4 = (pIVar5->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    pIVar5 = (IndirOpnd *)IR::Opnd::Copy(&pIVar5->super_Opnd,pFVar1);
    bVar4 = (pIVar5->super_Opnd).field_0xb;
  }
  (pIVar5->super_Opnd).field_0xb = bVar4 | 2;
  (instr->super_Instr).m_src1 = &pIVar5->super_Opnd;
  if ((instr->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005e3046;
    *puVar6 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005e3046:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  bVar4 = (this_01->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_01 = (IntConstOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar1);
    bVar4 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar4 | 2;
  (instr->super_Instr).m_src2 = &this_01->super_Opnd;
  IR::Instr::InsertBefore(insertBeforeInstr,&instr->super_Instr);
  return &instr->super_Instr;
}

Assistant:

IR::Instr*
Lowerer::InsertFunctionTypeIdCheck(IR::RegOpnd * funcOpnd, IR::Instr* insertBeforeInstr, IR::BailOutKind bailOutKind, BailOutInfo *bailOutInfo)
{
    IR::Instr *bailOutIfNotFunction = IR::BailOutInstr::New(Js::OpCode::BailOnNotEqual, bailOutKind, bailOutInfo, bailOutInfo->bailOutFunc);

    // functionTypeRegOpnd = Ld functionRegOpnd->type
    IR::IndirOpnd *functionTypeIndirOpnd = IR::IndirOpnd::New(funcOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, insertBeforeInstr->m_func);
    IR::RegOpnd *functionTypeRegOpnd = IR::RegOpnd::New(TyVar, insertBeforeInstr->m_func->GetTopFunc());
    IR::Instr *instr = IR::Instr::New(Js::OpCode::Ld_A, functionTypeRegOpnd, functionTypeIndirOpnd, insertBeforeInstr->m_func);
    if (instr->m_func->HasByteCodeOffset())
    {
        instr->SetByteCodeOffset(insertBeforeInstr);
    }
    insertBeforeInstr->InsertBefore(instr);

    CompileAssert(sizeof(Js::TypeId) == sizeof(int32));
    // if (functionTypeRegOpnd->typeId != TypeIds_Function) goto $noInlineLabel
    // BrNeq_I4 $noInlineLabel, functionTypeRegOpnd->typeId, TypeIds_Function
    IR::IndirOpnd *functionTypeIdIndirOpnd = IR::IndirOpnd::New(functionTypeRegOpnd, Js::Type::GetOffsetOfTypeId(), TyInt32, insertBeforeInstr->m_func);
    IR::IntConstOpnd *typeIdFunctionConstOpnd = IR::IntConstOpnd::New(Js::TypeIds_Function, TyInt32, insertBeforeInstr->m_func);
    bailOutIfNotFunction->SetSrc1(functionTypeIdIndirOpnd);
    bailOutIfNotFunction->SetSrc2(typeIdFunctionConstOpnd);
    insertBeforeInstr->InsertBefore(bailOutIfNotFunction);

    return bailOutIfNotFunction;
}